

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O2

iterator __thiscall
ImVector<ImGuiSettingsHandler>::insert
          (ImVector<ImGuiSettingsHandler> *this,const_iterator it,value_type *v)

{
  undefined8 *puVar1;
  int iVar2;
  int new_capacity;
  char *pcVar3;
  undefined8 uVar4;
  _func_void_ptr_ImGuiContext_ptr_ImGuiSettingsHandler_ptr_char_ptr *p_Var5;
  _func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr_void_ptr_char_ptr *p_Var6;
  void *pvVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  const_iterator pvVar12;
  
  pvVar12 = this->Data;
  if (pvVar12 <= it) {
    iVar2 = this->Size;
    lVar9 = (long)iVar2;
    if (it <= pvVar12 + lVar9) {
      lVar11 = (long)it - (long)pvVar12;
      if (iVar2 == this->Capacity) {
        if (iVar2 == 0) {
          iVar8 = 8;
        }
        else {
          iVar8 = iVar2 / 2 + iVar2;
        }
        new_capacity = iVar2 + 1;
        if (iVar2 + 1 < iVar8) {
          new_capacity = iVar8;
        }
        reserve(this,new_capacity);
        lVar9 = (long)this->Size;
        pvVar12 = this->Data;
      }
      lVar10 = lVar9 - lVar11 / 0x30;
      if (lVar10 != 0 && lVar11 / 0x30 <= lVar9) {
        memmove((void *)((long)pvVar12 + lVar11 + 0x30),(void *)((long)pvVar12 + lVar11),
                lVar10 * 0x30);
        pvVar12 = this->Data;
      }
      pcVar3 = v->TypeName;
      uVar4 = *(undefined8 *)&v->TypeHash;
      p_Var5 = v->ReadOpenFn;
      p_Var6 = v->ReadLineFn;
      pvVar7 = v->UserData;
      puVar1 = (undefined8 *)((long)pvVar12 + lVar11 + 0x20);
      *puVar1 = v->WriteAllFn;
      puVar1[1] = pvVar7;
      puVar1 = (undefined8 *)((long)pvVar12 + lVar11 + 0x10);
      *puVar1 = p_Var5;
      puVar1[1] = p_Var6;
      *(undefined8 *)((long)pvVar12 + lVar11) = pcVar3;
      ((undefined8 *)((long)pvVar12 + lVar11))[1] = uVar4;
      this->Size = this->Size + 1;
      return (iterator)(lVar11 + (long)this->Data);
    }
  }
  __assert_fail("it >= Data && it <= Data+Size",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                ,0x4e6,
                "iterator ImVector<ImGuiSettingsHandler>::insert(const_iterator, const value_type &) [T = ImGuiSettingsHandler]"
               );
}

Assistant:

inline iterator     insert(const_iterator it, const value_type& v)  { IM_ASSERT(it >= Data && it <= Data+Size); const ptrdiff_t off = it - Data; if (Size == Capacity) reserve(_grow_capacity(Size + 1)); if (off < (int)Size) memmove(Data + off + 1, Data + off, ((size_t)Size - (size_t)off) * sizeof(value_type)); memcpy(&Data[off], &v, sizeof(v)); Size++; return Data + off; }